

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void determine_system_keymap(void)

{
  uint keycode;
  bool bVar1;
  int iVar2;
  istream *piVar3;
  long lVar4;
  long *plVar5;
  char cVar6;
  uint keycode_00;
  int utf8code;
  uint local_388;
  allocator local_381;
  string line;
  string local_360 [32];
  stringstream ss;
  ostream local_330 [8];
  string local_328 [368];
  stringstream dump;
  
  memset(char_keys,0,0xc4);
  memset(shift_keys,0,0xc4);
  memset(altgr_keys,0,0xc4);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  execute_abi_cxx11_(&line,
                     "/usr/bin/dumpkeys -n | /bin/grep \'^\\([[:space:]]shift[[:space:]]\\)*\\([[:space:]]altgr[[:space:]]\\)*keycode\'"
                    );
  std::__cxx11::stringstream::stringstream((stringstream *)&dump,(string *)&line,_S_out|_S_in);
  std::__cxx11::string::~string((string *)&line);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  keycode = 0;
LAB_0010623a:
  do {
    keycode_00 = keycode;
    local_388 = keycode_00 + 1;
LAB_00106242:
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&dump,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
LAB_00106517:
      std::__cxx11::string::~string((string *)&line);
      std::__cxx11::stringstream::~stringstream((stringstream *)&dump);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return;
    }
    std::ios::clear((int)*(undefined8 *)(_ss + -0x18) + (int)&ss);
    std::__cxx11::string::string(local_360,"",&local_381);
    std::__cxx11::stringbuf::str(local_328);
    std::__cxx11::string::~string(local_360);
    utf8code = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::find((char *)&line,0x10869b);
      keycode = local_388;
      lVar4 = lVar4 << 0x20;
      if (lVar4 == -0x100000000) break;
      line._M_dataplus._M_p[lVar4 >> 0x20] = '0';
      line._M_dataplus._M_p[lVar4 + 0x100000000 >> 0x20] = 'x';
    }
    if (0x7f < keycode_00) goto LAB_00106517;
    bVar1 = is_char_key(local_388);
    if (!bVar1) goto LAB_0010623a;
    if (line._M_string_length == 0) {
      __assert_fail("line.size() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/regular-dev[P]MousKee/src/main.cpp"
                    ,0xbb,"void determine_system_keymap()");
    }
    if (*line._M_dataplus._M_p != 'k') {
      iVar2 = to_char_keys_index(keycode_00);
      std::operator<<(local_330,line._M_dataplus._M_p + 0x15);
      *(uint *)(local_328 + *(long *)(_ss + -0x18)) =
           *(uint *)(local_328 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
      std::istream::operator>>((istream *)&ss,&utf8code);
      if ((line._M_dataplus._M_p[0x15] == '+') && ((utf8code & 0xb00U) != 0)) {
        utf8code = utf8code ^ 0xb00;
      }
      cVar6 = line._M_dataplus._M_p[1];
      if (cVar6 == 's') {
        shift_keys[iVar2] = utf8code;
        cVar6 = line._M_dataplus._M_p[1];
      }
      if (cVar6 == 'a') {
        altgr_keys[iVar2] = utf8code;
      }
      goto LAB_00106242;
    }
    iVar2 = to_char_keys_index(keycode);
    std::operator<<(local_330,line._M_dataplus._M_p + 0xe);
    *(uint *)(local_328 + *(long *)(_ss + -0x18)) =
         *(uint *)(local_328 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
    std::istream::operator>>((istream *)&ss,&utf8code);
    if ((utf8code & 0xb00U) != 0 && line._M_dataplus._M_p[0xe] == '+') {
      utf8code = utf8code ^ 0xb00;
    }
    char_keys[iVar2] = utf8code;
    *(uint *)(local_328 + *(long *)(_ss + -0x18)) =
         *(uint *)(local_328 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
    plVar5 = (long *)std::istream::operator>>((istream *)&ss,&utf8code);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      if ((utf8code & 0xb00U) != 0 && line._M_dataplus._M_p[0xe] == '+') {
        utf8code = utf8code ^ 0xb00;
      }
      shift_keys[iVar2] = utf8code;
    }
    *(uint *)(local_328 + *(long *)(_ss + -0x18)) =
         *(uint *)(local_328 + *(long *)(_ss + -0x18)) & 0xffffffb5 | 8;
    plVar5 = (long *)std::istream::operator>>((istream *)&ss,&utf8code);
    keycode = local_388;
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      if ((utf8code & 0xb00U) != 0 && line._M_dataplus._M_p[0xe] == '+') {
        utf8code = utf8code ^ 0xb00;
      }
      altgr_keys[iVar2] = utf8code;
    }
  } while( true );
}

Assistant:

void determine_system_keymap()
{
    // custom map will be used; erase existing US keymapping
    memset(char_keys,  '\0', sizeof(char_keys));
    memset(shift_keys, '\0', sizeof(shift_keys));
    memset(altgr_keys, '\0', sizeof(altgr_keys));

    // get keymap from dumpkeys
    // if one knows of a better, more portable way to get wchar_t-s from symbolic keysym-s from `dumpkeys` or `xmodmap` or another, PLEASE LET ME KNOW! kthx
    std::stringstream ss, dump(execute(COMMAND_STR_DUMPKEYS));             // see example output after i.e. `loadkeys slovene`
    std::string line;

    unsigned int i = 0;             // keycode
    int index;
    int utf8code;             // utf-8 code of keysym answering keycode i

    while (std::getline(dump, line)) {
        ss.clear();
        ss.str("");
        utf8code = 0;

        // replace any U+#### with 0x#### for easier parsing
        index = line.find("U+", 0);
        while (static_cast<std::string::size_type>(index) != std::string::npos) {
            line[index] = '0'; line[index + 1] = 'x';
            index = line.find("U+", index);
        }

        if (++i >= sizeof(char_or_func)) break;                         // only ever map keycodes up to 128 (currently N_KEYS_DEFINED are used)
        if (!is_char_key(i)) continue;                         // only map character keys of keyboard

        assert(line.size() > 0);
        if (line[0] == 'k') {                         // if line starts with 'keycode'
            index = to_char_keys_index(i);

            ss << &line[14];                                     // 1st keysym starts at index 14 (skip "keycode XXX = ")
            ss >> std::hex >> utf8code;
            // 0XB00CLUELESS: 0xB00 is added to some keysyms that are preceeded with '+'; I don't really know why; see `man keymaps`; `man loadkeys` says numeric keysym values aren't to be relied on, orly?
            if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
            char_keys[index] = static_cast<wchar_t>(utf8code);

            // if there is a second keysym column, assume it is a shift column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                shift_keys[index] = static_cast<wchar_t>(utf8code);
            }

            // if there is a third keysym column, assume it is an altgr column
            if (ss >> std::hex >> utf8code) {
                if (line[14] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;
                altgr_keys[index] = static_cast<wchar_t>(utf8code);
            }

            continue;
        }

        // else if line starts with 'shift i'
        index = to_char_keys_index(--i);
        ss << &line[21];                         // 1st keysym starts at index 21 (skip "\tshift\tkeycode XXX = " or "\taltgr\tkeycode XXX = ")
        ss >> std::hex >> utf8code;
        if (line[21] == '+' && (utf8code & 0xB00)) utf8code ^= 0xB00;                         // see line 0XB00CLUELESS

        if (line[1] == 's')                         // if line starts with "shift"
            shift_keys[index] = static_cast<wchar_t>(utf8code);
        if (line[1] == 'a')                         // if line starts with "altgr"
            altgr_keys[index] = static_cast<wchar_t>(utf8code);
    }             // while (getline(dump, line))
}